

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

Error * ot::commissioner::coap::Message::SplitUriPath
                  (Error *__return_storage_ptr__,
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *aUriPathList,string *aUriPath)

{
  size_t *psVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  _Node *p_Var4;
  ulong uVar5;
  _List_node_base *local_58;
  _List_node_base *local_50;
  _List_node_base local_48;
  Error *local_38;
  
  uVar5 = 0;
  local_38 = __return_storage_ptr__;
  do {
    uVar2 = std::__cxx11::string::find((char)aUriPath,0x2f);
    if (uVar2 != 0xffffffffffffffff) {
      if (uVar5 < uVar2) {
        std::__cxx11::string::substr((ulong)&local_58,(ulong)aUriPath);
        p_Var3 = (_List_node_base *)operator_new(0x30);
        p_Var3[1]._M_next = p_Var3 + 2;
        if (local_58 == &local_48) {
          p_Var3[2]._M_next =
               (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_);
          p_Var3[2]._M_prev = local_48._M_prev;
        }
        else {
          p_Var3[1]._M_next = local_58;
          p_Var3[2]._M_next =
               (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_);
        }
        p_Var3[1]._M_prev = local_50;
        local_50 = (_List_node_base *)0x0;
        local_48._M_next._0_1_ = 0;
        local_58 = &local_48;
        std::__detail::_List_node_base::_M_hook(p_Var3);
        psVar1 = &(aUriPathList->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_58 != &local_48) {
          operator_delete(local_58);
        }
      }
      uVar5 = uVar2 + 1;
    }
  } while (uVar2 != 0xffffffffffffffff);
  if (uVar5 < aUriPath->_M_string_length) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)aUriPath);
    p_Var3 = (_List_node_base *)operator_new(0x30);
    p_Var3[1]._M_next = p_Var3 + 2;
    if (local_58 == &local_48) {
      p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_)
      ;
      p_Var3[2]._M_prev = local_48._M_prev;
    }
    else {
      p_Var3[1]._M_next = local_58;
      p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_48._M_next._1_7_,local_48._M_next._0_1_)
      ;
    }
    p_Var3[1]._M_prev = local_50;
    local_50 = (_List_node_base *)0x0;
    local_48._M_next._0_1_ = 0;
    local_58 = &local_48;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(aUriPathList->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
  }
  if ((aUriPathList->
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)aUriPathList) {
    p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<char_const(&)[2]>
                       ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                        aUriPathList,(char (*) [2])0x23c390);
    std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
    psVar1 = &(aUriPathList->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  local_38->mCode = kNone;
  (local_38->mMessage)._M_dataplus._M_p = (pointer)&(local_38->mMessage).field_2;
  (local_38->mMessage)._M_string_length = 0;
  (local_38->mMessage).field_2._M_local_buf[0] = '\0';
  return local_38;
}

Assistant:

Error Message::SplitUriPath(std::list<std::string> &aUriPathList, const std::string &aUriPath)
{
    const auto &uri = aUriPath;

    size_t begin = 0;
    while (true)
    {
        auto pos = uri.find_first_of('/', begin);
        if (pos == std::string::npos)
        {
            break;
        }
        if (pos > begin)
        {
            aUriPathList.emplace_back(uri.substr(begin, pos - begin));
        }
        begin = pos + 1;
    }

    if (begin < uri.size())
    {
        aUriPathList.emplace_back(uri.substr(begin));
    }

    if (aUriPathList.empty())
    {
        // For example, uri path is "/", "//"
        aUriPathList.emplace_back("/");
    }

    return ERROR_NONE;
}